

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

FuncDef * sqlite3FindFunction(sqlite3 *db,char *zName,int nArg,u8 enc,u8 createFlag)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  HashElem *pHVar5;
  FuncDef *pFVar6;
  byte *pbVar7;
  uint uVar8;
  int iVar9;
  FuncDef *data;
  
  iVar9 = 0;
  uVar8 = 0;
  if (zName != (char *)0x0) {
    sVar4 = strlen(zName);
    uVar8 = (uint)sVar4 & 0x3fffffff;
  }
  pHVar5 = findElementWithHash(&db->aFunc,zName,(uint *)0x0);
  pFVar6 = (FuncDef *)pHVar5->data;
  data = (FuncDef *)0x0;
  if (pFVar6 != (FuncDef *)0x0) {
    iVar9 = 0;
    data = (FuncDef *)0x0;
    do {
      iVar2 = matchQuality(pFVar6,nArg,enc);
      if (iVar9 < iVar2) {
        iVar9 = iVar2;
        data = pFVar6;
      }
      pFVar6 = pFVar6->pNext;
    } while (pFVar6 != (FuncDef *)0x0);
  }
  if ((createFlag == '\0') && ((data == (FuncDef *)0x0 || ((db->mDbFlags & 2) != 0)))) {
    uVar3 = ""[(byte)*zName] + uVar8;
    pFVar6 = sqlite3FunctionSearch(uVar3 / 0x17 + (uVar3 / 0x17) * -0x18 + uVar3,zName);
    if (pFVar6 == (FuncDef *)0x0) {
      iVar9 = 0;
    }
    else {
      iVar9 = 0;
      do {
        iVar2 = matchQuality(pFVar6,nArg,enc);
        if (iVar9 < iVar2) {
          iVar9 = iVar2;
          data = pFVar6;
        }
        pFVar6 = pFVar6->pNext;
      } while (pFVar6 != (FuncDef *)0x0);
    }
  }
  if ((createFlag != '\0') && (iVar9 < 6)) {
    data = (FuncDef *)sqlite3DbMallocZero(db,(ulong)(uVar8 + 0x49));
    if (data == (FuncDef *)0x0) {
      data = (FuncDef *)0x0;
    }
    else {
      data->zName = (char *)(data + 1);
      data->nArg = (i16)nArg;
      data->funcFlags = (uint)enc;
      memcpy(data + 1,zName,(ulong)(uVar8 + 1));
      bVar1 = (byte)data[1].nArg;
      if (bVar1 != 0) {
        pbVar7 = (byte *)((long)&data[1].nArg + 1);
        do {
          pbVar7[-1] = ""[bVar1];
          bVar1 = *pbVar7;
          pbVar7 = pbVar7 + 1;
        } while (bVar1 != 0);
      }
      pFVar6 = (FuncDef *)sqlite3HashInsert(&db->aFunc,data->zName,data);
      if (pFVar6 == data) {
        sqlite3DbFreeNN(db,data);
        sqlite3OomFault(db);
        return (FuncDef *)0x0;
      }
      data->pNext = pFVar6;
    }
  }
  if (data != (FuncDef *)0x0) {
    if (createFlag != '\0') {
      return data;
    }
    if (data->xSFunc != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
      return data;
    }
  }
  return (FuncDef *)0x0;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3FindFunction(
  sqlite3 *db,       /* An open database */
  const char *zName, /* Name of the function.  zero-terminated */
  int nArg,          /* Number of arguments.  -1 means any number */
  u8 enc,            /* Preferred text encoding */
  u8 createFlag      /* Create new entry if true and does not otherwise exist */
){
  FuncDef *p;         /* Iterator variable */
  FuncDef *pBest = 0; /* Best match found so far */
  int bestScore = 0;  /* Score of best match */
  int h;              /* Hash value */
  int nName;          /* Length of the name */

  assert( nArg>=(-2) );
  assert( nArg>=(-1) || createFlag==0 );
  nName = sqlite3Strlen30(zName);

  /* First search for a match amongst the application-defined functions.
  */
  p = (FuncDef*)sqlite3HashFind(&db->aFunc, zName);
  while( p ){
    int score = matchQuality(p, nArg, enc);
    if( score>bestScore ){
      pBest = p;
      bestScore = score;
    }
    p = p->pNext;
  }

  /* If no match is found, search the built-in functions.
  **
  ** If the DBFLAG_PreferBuiltin flag is set, then search the built-in
  ** functions even if a prior app-defined function was found.  And give
  ** priority to built-in functions.
  **
  ** Except, if createFlag is true, that means that we are trying to
  ** install a new function.  Whatever FuncDef structure is returned it will
  ** have fields overwritten with new information appropriate for the
  ** new function.  But the FuncDefs for built-in functions are read-only.
  ** So we must not search for built-ins when creating a new function.
  */
  if( !createFlag && (pBest==0 || (db->mDbFlags & DBFLAG_PreferBuiltin)!=0) ){
    bestScore = 0;
    h = SQLITE_FUNC_HASH(sqlite3UpperToLower[(u8)zName[0]], nName);
    p = sqlite3FunctionSearch(h, zName);
    while( p ){
      int score = matchQuality(p, nArg, enc);
      if( score>bestScore ){
        pBest = p;
        bestScore = score;
      }
      p = p->pNext;
    }
  }

  /* If the createFlag parameter is true and the search did not reveal an
  ** exact match for the name, number of arguments and encoding, then add a
  ** new entry to the hash table and return it.
  */
  if( createFlag && bestScore<FUNC_PERFECT_MATCH &&
      (pBest = sqlite3DbMallocZero(db, sizeof(*pBest)+nName+1))!=0 ){
    FuncDef *pOther;
    u8 *z;
    pBest->zName = (const char*)&pBest[1];
    pBest->nArg = (u16)nArg;
    pBest->funcFlags = enc;
    memcpy((char*)&pBest[1], zName, nName+1);
    for(z=(u8*)pBest->zName; *z; z++) *z = sqlite3UpperToLower[*z];
    pOther = (FuncDef*)sqlite3HashInsert(&db->aFunc, pBest->zName, pBest);
    if( pOther==pBest ){
      sqlite3DbFree(db, pBest);
      sqlite3OomFault(db);
      return 0;
    }else{
      pBest->pNext = pOther;
    }
  }

  if( pBest && (pBest->xSFunc || createFlag) ){
    return pBest;
  }
  return 0;
}